

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

void __thiscall Token::Token(Token *this)

{
  char *__end;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->_relOp)._M_dataplus._M_p = (pointer)&(this->_relOp).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_relOp,"","");
  this->_ded = false;
  this->_isWholeNumber = false;
  this->_isString = false;
  this->_symbol = '\0';
  this->_eof = false;
  this->_eol = false;
  this->_ind = false;
  this->_ded = false;
  (this->_string)._M_dataplus._M_p = (pointer)&(this->_string).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_string,"");
  return;
}

Assistant:

Token::Token(): _name{""}, _eof{false}, _eol{false}, _symbol{'\0'},
_isWholeNumber{false}, _ind{false},_ded{false}, _relOp{""}, _string{""},_isString{false}{}